

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O0

int __thiscall TPZSFMatrix<long_double>::Decompose_LDLt(TPZSFMatrix<long_double> *this)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long *in_RDI;
  longdouble in_ST0;
  longdouble lVar5;
  longdouble lVar6;
  longdouble in_ST1;
  longdouble lVar7;
  longdouble lVar8;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  int k_1;
  int l;
  int k;
  longdouble sum;
  int j;
  char *in_stack_00000108;
  char *in_stack_00000110;
  undefined8 in_stack_ffffffffffffff12;
  longdouble local_68;
  int local_50;
  int local_4c;
  longdouble local_48;
  int local_2c;
  longdouble local_28;
  int local_14;
  
  if (((char)in_RDI[3] == '\0') || ((char)in_RDI[3] == '\x04')) {
    if ((char)in_RDI[3] != '\0') {
      return 0;
    }
  }
  else {
    TPZMatrix<long_double>::Error(in_stack_00000110,in_stack_00000108);
  }
  for (local_14 = 0; lVar3 = (long)local_14, lVar4 = (**(code **)(*in_RDI + 0x60))(), lVar3 < lVar4;
      local_14 = local_14 + 1) {
    local_28 = (longdouble)0;
    lVar5 = in_ST1;
    lVar6 = in_ST2;
    in_ST1 = in_ST3;
    in_ST2 = in_ST4;
    in_ST3 = in_ST5;
    in_ST4 = in_ST6;
    for (local_2c = 0; local_2c < local_14; local_2c = local_2c + 1) {
      lVar8 = in_ST4;
      (**(code **)(*in_RDI + 0x120))(in_RDI,(long)local_2c);
      (**(code **)(*in_RDI + 0x120))(in_RDI,(long)local_2c,(long)local_14);
      lVar7 = in_ST0 * lVar5;
      in_ST0 = in_ST1;
      lVar5 = in_ST2;
      in_ST1 = in_ST4;
      in_ST2 = lVar8;
      (**(code **)(*in_RDI + 0x120))(in_RDI,(long)local_2c,(long)local_14);
      local_28 = local_28 + lVar7 * lVar6;
      lVar6 = in_ST3;
      in_ST3 = in_ST2;
      in_ST4 = in_ST2;
    }
    lVar3 = (long)local_14;
    (**(code **)(*in_RDI + 0x120))(in_RDI,lVar3);
    local_48 = in_ST0 - local_28;
    in_ST5 = in_ST4;
    in_ST6 = in_ST4;
    (**(code **)(*in_RDI + 0x118))(in_RDI,lVar3,lVar3,&local_48);
    in_ST0 = lVar6;
    (**(code **)(*in_RDI + 0x120))(in_RDI,(long)local_14,(long)local_14);
    bVar2 = IsZero((longdouble)CONCAT82(in_stack_ffffffffffffff12,(short)((unkuint10)lVar5 >> 0x40))
                  );
    iVar1 = local_14;
    if (bVar2) {
      TPZMatrix<long_double>::Error(in_stack_00000110,in_stack_00000108);
      iVar1 = local_14;
    }
    while( true ) {
      local_4c = iVar1 + 1;
      lVar3 = (long)local_4c;
      lVar4 = (**(code **)(*in_RDI + 0x60))();
      if (lVar4 <= lVar3) break;
      local_28 = (longdouble)0;
      lVar5 = in_ST1;
      lVar6 = in_ST2;
      in_ST1 = in_ST3;
      in_ST2 = in_ST4;
      in_ST3 = in_ST5;
      in_ST4 = in_ST6;
      for (local_50 = 0; local_50 < local_14; local_50 = local_50 + 1) {
        lVar8 = in_ST4;
        (**(code **)(*in_RDI + 0x120))(in_RDI,(long)local_50);
        (**(code **)(*in_RDI + 0x120))(in_RDI,(long)local_14,(long)local_50);
        lVar7 = in_ST0 * lVar5;
        in_ST0 = in_ST1;
        lVar5 = in_ST2;
        in_ST1 = in_ST4;
        in_ST2 = lVar8;
        (**(code **)(*in_RDI + 0x120))(in_RDI,(long)local_4c,(long)local_50);
        local_28 = local_28 + lVar7 * lVar6;
        lVar6 = in_ST3;
        in_ST3 = in_ST2;
        in_ST4 = in_ST2;
      }
      lVar4 = (long)local_4c;
      lVar3 = (long)local_14;
      (**(code **)(*in_RDI + 0x120))();
      lVar8 = in_ST0 - local_28;
      in_ST0 = lVar6;
      in_ST5 = in_ST4;
      (**(code **)(*in_RDI + 0x120))(in_RDI,(long)local_14);
      local_68 = lVar8 / lVar5;
      in_ST6 = in_ST5;
      (**(code **)(*in_RDI + 0x118))(in_RDI,lVar4,lVar3,&local_68);
      iVar1 = local_4c;
    }
  }
  *(undefined1 *)(in_RDI + 3) = 4;
  *(undefined1 *)((long)in_RDI + 0x19) = 0;
  return 1;
}

Assistant:

int
TPZSFMatrix<TVar> ::Decompose_LDLt()
{
	if (  this->fDecomposed && this->fDecomposed != ELDLt)
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__,"Decompose_LDLt <Matrix already Decomposed with a different scheme>" );
	else if ( this->fDecomposed ) return 0;
	
	//	TVar sum;
	
	
	for ( auto j = 0; j < this->Dim(); j++ )
    {
		TVar sum=0.;
		for ( auto k=0; k<j; k++){
			if constexpr (is_complex<TVar>::value){
				sum+=GetVal(k,k)*std::conj(GetVal(k,j))*GetVal(k,j);
			}else{
				sum+=GetVal(k,k)*GetVal(k,j)*GetVal(k,j);
			}
		}
		PutVal(j,j,GetVal(j,j)-sum);
		if ( IsZero(GetVal(j,j)) )TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__,"Decompose_LDLt <Zero on diagonal>" );
		for( auto l=j+1; l<this->Dim();l++)
		{
			sum = 0;
			for ( auto k=0; k<j; k++){
				if constexpr(is_complex<TVar>::value){
					sum+=GetVal(k,k)*std::conj(GetVal(j,k))*GetVal(l,k);
				}else{
					sum+=GetVal(k,k)*GetVal(j,k)*GetVal(l,k);
				}
			}
			PutVal(l,j, (GetVal(l,j)-sum)/GetVal(j,j) );
		}
		
    }
	this->fDecomposed  = ELDLt;
	this->fDefPositive = 0;
	
    
	return( 1 );
}